

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

void __thiscall
IntBounds::IntBounds
          (IntBounds *this,IntConstantBounds *constantBounds,
          bool wasConstantUpperBoundEstablishedExplicitly,JitArenaAllocator *allocator)

{
  int32 iVar1;
  JitArenaAllocator *allocator_local;
  bool wasConstantUpperBoundEstablishedExplicitly_local;
  IntConstantBounds *constantBounds_local;
  IntBounds *this_local;
  
  iVar1 = IntConstantBounds::LowerBound(constantBounds);
  this->constantLowerBound = iVar1;
  iVar1 = IntConstantBounds::UpperBound(constantBounds);
  this->constantUpperBound = iVar1;
  this->wasConstantUpperBoundEstablishedExplicitly = wasConstantUpperBoundEstablishedExplicitly;
  JsUtil::
  BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->relativeLowerBounds,allocator,0);
  JsUtil::
  BaseHashSet<ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->relativeUpperBounds,allocator,0);
  return;
}

Assistant:

IntBounds::IntBounds(
    const IntConstantBounds &constantBounds,
    const bool wasConstantUpperBoundEstablishedExplicitly,
    JitArenaAllocator *const allocator)
    :
    constantLowerBound(constantBounds.LowerBound()),
    constantUpperBound(constantBounds.UpperBound()),
    wasConstantUpperBoundEstablishedExplicitly(wasConstantUpperBoundEstablishedExplicitly),
    relativeLowerBounds(allocator),
    relativeUpperBounds(allocator)
{
}